

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdiff.c
# Opt level: O1

void split(int64_t *I,int64_t *V,int64_t start,int64_t len,int64_t h)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int64_t iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  do {
    if (len < 0x10) {
      if (len < 1) {
        return;
      }
      lVar14 = len + start;
      do {
        plVar2 = I + start;
        lVar5 = start + 1;
        lVar9 = 1;
        if (lVar5 < lVar14) {
          iVar11 = V[h + *plVar2];
          do {
            lVar7 = V[h + I[lVar5]];
            lVar13 = iVar11;
            if (lVar7 < iVar11) {
              lVar13 = lVar7;
              lVar9 = 0;
            }
            if (lVar7 <= iVar11) {
              lVar7 = plVar2[lVar9];
              plVar2[lVar9] = I[lVar5];
              I[lVar5] = lVar7;
              lVar9 = lVar9 + 1;
            }
            lVar5 = lVar5 + 1;
            iVar11 = lVar13;
          } while (lVar5 < lVar14);
        }
        if (0 < lVar9) {
          lVar5 = 0;
          do {
            V[plVar2[lVar5]] = start + lVar9 + -1;
            lVar5 = lVar5 + 1;
          } while (lVar9 != lVar5);
        }
        if (lVar9 == 1) {
          *plVar2 = -1;
        }
        start = start + lVar9;
      } while (start < lVar14);
      return;
    }
    lVar14 = V[h + *(long *)((long)I + start * 8 + (len & 0xfffffffffffffffeU) * 4)];
    lVar13 = len + start;
    lVar7 = 0;
    lVar5 = start;
    lVar9 = 0;
    do {
      lVar8 = lVar9;
      lVar3 = V[h + I[lVar5]];
      lVar7 = lVar7 + (ulong)(lVar3 < lVar14);
      lVar9 = (ulong)(lVar3 == lVar14) + lVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 < lVar13);
    lVar5 = lVar7 + start;
    lVar1 = lVar5 + lVar9;
    if (lVar7 == 0) {
      lVar10 = 0;
      lVar6 = 0;
    }
    else {
      lVar6 = 0;
      lVar10 = 0;
      lVar12 = start;
      do {
        lVar4 = I[lVar12];
        if (V[h + lVar4] < lVar14) {
          lVar12 = lVar12 + 1;
        }
        else if (V[h + lVar4] == lVar14) {
          I[lVar12] = I[lVar5 + lVar10];
          I[lVar5 + lVar10] = lVar4;
          lVar10 = lVar10 + 1;
        }
        else {
          I[lVar12] = I[lVar1 + lVar6];
          I[lVar1 + lVar6] = lVar4;
          lVar6 = lVar6 + 1;
        }
      } while (lVar12 < lVar5);
    }
    while (lVar10 < lVar9) {
      lVar12 = I[lVar5 + lVar10];
      if (V[h + lVar12] == lVar14) {
        lVar10 = lVar10 + 1;
      }
      else {
        I[lVar5 + lVar10] = I[lVar1 + lVar6];
        I[lVar1 + lVar6] = lVar12;
        lVar6 = lVar6 + 1;
      }
    }
    if (lVar7 != 0) {
      split(I,V,start,lVar7,h);
    }
    if (lVar9 != 0) {
      lVar9 = 0;
      do {
        V[I[lVar5 + lVar9]] = lVar1 + -1;
        lVar9 = lVar9 + 1;
      } while (lVar8 + (ulong)(lVar3 == lVar14) != lVar9);
    }
    if (lVar5 == lVar1 + -1) {
      I[lVar5] = -1;
    }
    len = lVar13 - lVar1;
    start = lVar1;
  } while (len != 0 && lVar1 <= lVar13);
  return;
}

Assistant:

static void split(int64_t *I,int64_t *V,int64_t start,int64_t len,int64_t h)
{
	int64_t i,j,k,x,tmp,jj,kk;

	if(len<16) {
		for(k=start;k<start+len;k+=j) {
			j=1;x=V[I[k]+h];
			for(i=1;k+i<start+len;i++) {
				if(V[I[k+i]+h]<x) {
					x=V[I[k+i]+h];
					j=0;
				};
				if(V[I[k+i]+h]==x) {
					tmp=I[k+j];I[k+j]=I[k+i];I[k+i]=tmp;
					j++;
				};
			};
			for(i=0;i<j;i++) V[I[k+i]]=k+j-1;
			if(j==1) I[k]=-1;
		};
		return;
	};

	x=V[I[start+len/2]+h];
	jj=0;kk=0;
	for(i=start;i<start+len;i++) {
		if(V[I[i]+h]<x) jj++;
		if(V[I[i]+h]==x) kk++;
	};
	jj+=start;kk+=jj;

	i=start;j=0;k=0;
	while(i<jj) {
		if(V[I[i]+h]<x) {
			i++;
		} else if(V[I[i]+h]==x) {
			tmp=I[i];I[i]=I[jj+j];I[jj+j]=tmp;
			j++;
		} else {
			tmp=I[i];I[i]=I[kk+k];I[kk+k]=tmp;
			k++;
		};
	};

	while(jj+j<kk) {
		if(V[I[jj+j]+h]==x) {
			j++;
		} else {
			tmp=I[jj+j];I[jj+j]=I[kk+k];I[kk+k]=tmp;
			k++;
		};
	};

	if(jj>start) split(I,V,start,jj-start,h);

	for(i=0;i<kk-jj;i++) V[I[jj+i]]=kk-1;
	if(jj==kk-1) I[jj]=-1;

	if(start+len>kk) split(I,V,kk,start+len-kk,h);
}